

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

void show_conduct(int final)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_140;
  undefined1 local_130 [8];
  menulist menu;
  int cdt;
  int ngenocided;
  char buf [256];
  int final_local;
  
  init_menulist((menulist *)local_130);
  for (menu.size = 0; menu.size < 10; menu.size = menu.size + 1) {
    bVar1 = successful_cdt(menu.size);
    if (bVar1 == '\0') {
      bVar1 = intended_cdt(menu.size);
      if (bVar1 != '\0') {
        pcVar2 = "have ";
        if (final != 0) {
          pcVar2 = "";
        }
        enlght_line((menulist *)local_130,"You ",pcVar2,conducts[menu.size].failtxt);
      }
    }
    else {
      bVar1 = superfluous_cdt(menu.size);
      if (bVar1 == '\0') {
        if (final == 0) {
          local_140 = conducts[menu.size].presenttxt;
        }
        else {
          local_140 = conducts[menu.size].pasttxt;
        }
        enlght_line((menulist *)local_130,conducts[menu.size].prefix,local_140,
                    conducts[menu.size].suffix);
      }
    }
  }
  bVar1 = failed_cdt(0);
  if ((bVar1 != '\0') || (bVar1 = failed_cdt(1), bVar1 != '\0')) {
    if (u.uconduct.killer == 0) {
      pcVar2 = "have never ";
      if (final != 0) {
        pcVar2 = "never ";
      }
      enlght_line((menulist *)local_130,"You ",pcVar2,"killed a creature");
    }
    else {
      pcVar2 = "s";
      if (u.uconduct.killer == 1) {
        pcVar2 = "";
      }
      sprintf((char *)&cdt,"killed %u creature%s",(ulong)u.uconduct.killer,pcVar2);
      pcVar2 = "have ";
      if (final != 0) {
        pcVar2 = "";
      }
      enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
    }
  }
  if (u.uconduct.weaphit == 0) {
    pcVar2 = "have never ";
    if (final != 0) {
      pcVar2 = "never ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"hit with a wielded weapon");
  }
  else if ((flags.debug != '\0') || (final != 0)) {
    pcVar2 = "s";
    if (u.uconduct.weaphit == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt,"used a wielded weapon %u time%s",(ulong)u.uconduct.weaphit,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (((flags.debug != '\0') || (final != 0)) && (u.uconduct.literate != 0)) {
    pcVar2 = "s";
    if (u.uconduct.literate == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt,"read items or engraved %u time%s",(ulong)u.uconduct.literate,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (((flags.debug != '\0') || (final != 0)) && (u.uconduct.armoruses != 0)) {
    pcVar2 = "s";
    if (u.uconduct.armoruses == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt,"put on armor %u time%s",(ulong)u.uconduct.armoruses,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if ((u.uconduct.unracearmor == 0) && (u.uconduct.armoruses != 0)) {
    sprintf((char *)&cdt,"wearing only %s armor",urace.adj);
    pcVar2 = "have been ";
    if (final != 0) {
      pcVar2 = "were ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  menu.icount = num_genocides();
  if (menu.icount == 0) {
    pcVar2 = "have never ";
    if (final != 0) {
      pcVar2 = "never ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"genocided any monsters");
  }
  else {
    pcVar2 = "s";
    if (menu.icount == 1) {
      pcVar2 = "";
    }
    pcVar3 = "s";
    if (menu.icount == 1) {
      pcVar3 = "";
    }
    sprintf((char *)&cdt,"genocided %d type%s of monster%s",(ulong)(uint)menu.icount,pcVar2,pcVar3);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (u.uconduct.polypiles == 0) {
    pcVar2 = "have never ";
    if (final != 0) {
      pcVar2 = "never ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"polymorphed an object");
  }
  else if ((flags.debug != '\0') || (final != 0)) {
    pcVar2 = "s";
    if (u.uconduct.polypiles == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt,"polymorphed %u item%s",(ulong)u.uconduct.polypiles,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (u.uconduct.polyselfs == 0) {
    pcVar2 = "have never ";
    if (final != 0) {
      pcVar2 = "never ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"changed form");
  }
  else if ((flags.debug != '\0') || (final != 0)) {
    pcVar2 = "s";
    if (u.uconduct.polyselfs == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt,"changed form %u time%s",(ulong)u.uconduct.polyselfs,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (u.uconduct.wishes == 0) {
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"used no wishes");
  }
  else {
    pcVar2 = "";
    if (1 < u.uconduct.wishes) {
      pcVar2 = "es";
    }
    sprintf((char *)&cdt,"used %u wish%s",(ulong)u.uconduct.wishes,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
    if (u.uconduct.wishmagic != 0) {
      pcVar2 = "";
      if (1 < u.uconduct.wishmagic) {
        pcVar2 = "es";
      }
      sprintf((char *)&cdt,"used %u wish%s for magical items",(ulong)u.uconduct.wishmagic,pcVar2);
      pcVar2 = "have ";
      if (final != 0) {
        pcVar2 = "";
      }
      enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
    }
    if (u.uconduct.wisharti == 0) {
      pcVar2 = "have not wished";
      if (final != 0) {
        pcVar2 = "did not wish";
      }
      enlght_line((menulist *)local_130,"You ",pcVar2," for any artifacts");
    }
  }
  if (flags.elbereth_enabled == '\0') {
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"abstained from Elbereth\'s help");
  }
  else if (u.uconduct.elbereths == 0) {
    pcVar2 = "have never ";
    if (final != 0) {
      pcVar2 = "never ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"wrote Elbereth\'s name");
  }
  else {
    pcVar2 = "s";
    if (u.uconduct.elbereths == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt," Elbereth\'s name %u time%s",(ulong)u.uconduct.elbereths,pcVar2);
    pcVar2 = "have written";
    if (final != 0) {
      pcVar2 = "wrote";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (((flags.debug == '\0') && (final == 0)) || (u.uconduct.bones == 0)) {
    if ((flags.debug != '\0') || (final != 0)) {
      pcVar2 = "have never ";
      if (final != 0) {
        pcVar2 = "never ";
      }
      enlght_line((menulist *)local_130,"You ",pcVar2,"encountered a bones level");
    }
  }
  else {
    pcVar2 = "s";
    if (u.uconduct.bones == 1) {
      pcVar2 = "";
    }
    sprintf((char *)&cdt,"encountered %u bones level%s",(ulong)u.uconduct.bones,pcVar2);
    pcVar2 = "have ";
    if (final != 0) {
      pcVar2 = "";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
  }
  if (((flags.debug == '\0') && (final == 0)) || (u.uconduct.sokoban != 0)) {
    if ((flags.debug != '\0') || (final != 0)) {
      pcVar2 = "s";
      if (u.uconduct.sokoban == 1) {
        pcVar2 = "";
      }
      sprintf((char *)&cdt,"used %u Sokoban shortcut%s",(ulong)u.uconduct.sokoban,pcVar2);
      pcVar2 = "have ";
      if (final != 0) {
        pcVar2 = "";
      }
      enlght_line((menulist *)local_130,"You ",pcVar2,(char *)&cdt);
    }
  }
  else {
    pcVar2 = "have never ";
    if (final != 0) {
      pcVar2 = "never ";
    }
    enlght_line((menulist *)local_130,"You ",pcVar2,"used any Sokoban shortcuts");
  }
  display_menu((nh_menuitem *)local_130,menu.items._4_4_,"Voluntary challenges:",0,(int *)0x0);
  free((void *)local_130);
  return;
}

Assistant:

void show_conduct(int final)
{
	char buf[BUFSZ];
	int ngenocided;
	int cdt;
	struct menulist menu;

	/* Create the conduct window */
	init_menulist(&menu);

	/* List all major conducts. */
	for (cdt = FIRST_CONDUCT; cdt <= LAST_CONDUCT; cdt++) {
	    if (successful_cdt(cdt)) {
		if (!superfluous_cdt(cdt)) {
		    enl_msg(&menu,
			    conducts[cdt].prefix,	/* "You "       */
			    conducts[cdt].presenttxt,	/* "have been"  */
			    conducts[cdt].pasttxt,	/* "were"       */
			    conducts[cdt].suffix);	/* "a pacifist" */
		}
	    } else if (intended_cdt(cdt)) {
		/* "pretended to be a pacifist" */
		you_have_X(&menu, conducts[cdt].failtxt);
	    }
	}
	if (failed_cdt(CONDUCT_PACIFISM) || failed_cdt(CONDUCT_SADISM)) {
	    if (u.uconduct.killer == 0) {
		you_have_never(&menu, "killed a creature");
	    } else {
		sprintf(buf, "killed %u creature%s", u.uconduct.killer,
			plur(u.uconduct.killer));
		you_have_X(&menu, buf);
	    }
	}

	/* Now list the remaining statistical details. */

	if (!u.uconduct.weaphit)
	    you_have_never(&menu, "hit with a wielded weapon");
	else if (wizard || final) {
	    sprintf(buf, "used a wielded weapon %u time%s",
		    u.uconduct.weaphit, plur(u.uconduct.weaphit));
	    you_have_X(&menu, buf);
	}

	if ((wizard || final) && u.uconduct.literate) {
	    sprintf(buf, "read items or engraved %u time%s",
		    u.uconduct.literate, plur(u.uconduct.literate));
	    you_have_X(&menu, buf);
	}

	if ((wizard || final) && u.uconduct.armoruses) {
	    sprintf(buf, "put on armor %u time%s",
		    u.uconduct.armoruses, plur(u.uconduct.armoruses));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.unracearmor && u.uconduct.armoruses > 0) {
	    sprintf(buf, "wearing only %s armor", urace.adj);
	    you_have_been(&menu, buf);
	}

	ngenocided = num_genocides();
	if (ngenocided == 0) {
	    you_have_never(&menu, "genocided any monsters");
	} else {
	    sprintf(buf, "genocided %d type%s of monster%s",
		    ngenocided, plur(ngenocided), plur(ngenocided));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.polypiles)
	    you_have_never(&menu, "polymorphed an object");
	else if ((wizard || final)) {
	    sprintf(buf, "polymorphed %u item%s",
		    u.uconduct.polypiles, plur(u.uconduct.polypiles));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.polyselfs)
	    you_have_never(&menu, "changed form");
	else if ((wizard || final)) {
	    sprintf(buf, "changed form %u time%s",
		    u.uconduct.polyselfs, plur(u.uconduct.polyselfs));
	    you_have_X(&menu, buf);
	}

	if (!u.uconduct.wishes)
	    you_have_X(&menu, "used no wishes");
	else {
	    sprintf(buf, "used %u wish%s",
		    u.uconduct.wishes, (u.uconduct.wishes > 1L) ? "es" : "");
	    you_have_X(&menu, buf);

	    if (u.uconduct.wishmagic) {
		sprintf(buf, "used %u wish%s for magical items",
			u.uconduct.wishmagic, u.uconduct.wishmagic > 1 ? "es" : "");
		you_have_X(&menu, buf);
	    }

	    if (!u.uconduct.wisharti)
		enl_msg(&menu, You_, "have not wished", "did not wish",
			" for any artifacts");
	}

	if (flags.elbereth_enabled) {
	    if (!u.uconduct.elbereths)
		you_have_never(&menu, "wrote Elbereth's name");
	    else {
		sprintf(buf, " Elbereth's name %u time%s",
			u.uconduct.elbereths, plur(u.uconduct.elbereths));
		enl_msg(&menu, You_, "have written", "wrote", buf);
	    }
	} else {
	    you_have_X(&menu, "abstained from Elbereth's help");
	}

	if ((wizard || final) && u.uconduct.bones) {
	    sprintf(buf, "encountered %u bones level%s",
		    u.uconduct.bones, plur(u.uconduct.bones));
	    you_have_X(&menu, buf);
	} else if (wizard || final) {
	    you_have_never(&menu, "encountered a bones level");
	}

	if ((wizard || final) && !u.uconduct.sokoban) {
	    you_have_never(&menu, "used any Sokoban shortcuts");
	} else if (wizard || final) {
	    sprintf(buf, "used %u Sokoban shortcut%s",
		    u.uconduct.sokoban, plur(u.uconduct.sokoban));
	    you_have_X(&menu, buf);
	}

	/* Pop up the window and wait for a key */
	display_menu(menu.items, menu.icount, "Voluntary challenges:", PICK_NONE, NULL);
	free(menu.items);
}